

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O0

RecyclableObject *
Js::JavascriptOperators::IteratorNext
          (RecyclableObject *iterator,ScriptContext *scriptContext,RecyclableObject *nextFunc,
          Var value)

{
  anon_class_24_3_b5d8a029 implicitCall;
  bool bVar1;
  BOOL BVar2;
  ThreadContext *this;
  Var instance;
  JavascriptLibrary *this_00;
  Var result;
  ThreadContext *threadContext;
  Var value_local;
  RecyclableObject *nextFunc_local;
  ScriptContext *scriptContext_local;
  RecyclableObject *iterator_local;
  
  this = ScriptContext::GetThreadContext(scriptContext);
  implicitCall.value = value;
  implicitCall.iterator = iterator;
  implicitCall.nextFunc = nextFunc;
  instance = ThreadContext::
             ExecuteImplicitCall<Js::JavascriptOperators::IteratorNext(Js::RecyclableObject*,Js::ScriptContext*,Js::RecyclableObject*,void*)::__0>
                       (this,nextFunc,ImplicitCall_Accessor,implicitCall);
  BVar2 = IsObject(instance);
  if (BVar2 == 0) {
    bVar1 = ThreadContext::RecordImplicitException(this);
    if (bVar1) {
      JavascriptError::ThrowTypeError(scriptContext,-0x7ff5ec71,(PCWSTR)0x0);
    }
    this_00 = ScriptContext::GetLibrary(scriptContext);
    iterator_local = JavascriptLibraryBase::GetUndefined(&this_00->super_JavascriptLibraryBase);
  }
  else {
    iterator_local = VarTo<Js::RecyclableObject>(instance);
  }
  return iterator_local;
}

Assistant:

RecyclableObject* JavascriptOperators::IteratorNext(RecyclableObject* iterator, ScriptContext* scriptContext, RecyclableObject* nextFunc, Var value)
    {
        ThreadContext *threadContext = scriptContext->GetThreadContext();

        Var result = threadContext->ExecuteImplicitCall(nextFunc, ImplicitCall_Accessor, [=]() -> Var
            {
                Js::Var args[] = { iterator, value };
                Js::CallInfo callInfo(Js::CallFlags_Value, _countof(args) + (value == nullptr ? -1 : 0));
                return JavascriptFunction::CallFunction<true>(nextFunc, nextFunc->GetEntryPoint(), Arguments(callInfo, args));
            });

        if (!JavascriptOperators::IsObject(result))
        {
            if (!threadContext->RecordImplicitException())
            {
                return scriptContext->GetLibrary()->GetUndefined();
            }
            JavascriptError::ThrowTypeError(scriptContext, JSERR_NeedObject);
        }

        return VarTo<RecyclableObject>(result);
    }